

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall
ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace_HashTable(ON_SubD_FixedSizeHeap *this)

{
  uint uVar1;
  uint uVar2;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **ppOVar3;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *pOVar4;
  bool bVar5;
  uint uVar6;
  
  uVar1 = this->m_v_capacity;
  uVar2 = this->m_h_capacity;
  uVar6 = (uVar1 >> 2) + 1;
  if (uVar1 != 0) {
    uVar1 = uVar6;
  }
  this->m_h_count = 0;
  if (uVar2 < uVar1) {
    this->m_h_capacity = 0;
    if (this->m_hash_elements != (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0) {
      operator_delete__(this->m_hash_elements);
      this->m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0;
    }
    if (this->m_hash_table != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
      operator_delete__(this->m_hash_table);
      this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
    }
    ppOVar3 = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)
              ON_SubD__Allocate((ulong)uVar1 << 3);
    this->m_hash_table = ppOVar3;
    if (ppOVar3 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
      pOVar4 = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)
               ON_SubD__Allocate((ulong)this->m_v_capacity * 0x18);
      this->m_hash_elements = pOVar4;
      if (pOVar4 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0) {
        this->m_h_capacity = uVar1;
        uVar2 = uVar6;
        goto LAB_00612a8a;
      }
      ON_SubD__Free(this->m_hash_table);
      this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
    }
    bVar5 = false;
  }
  else {
    if (uVar2 == 0) {
      return true;
    }
LAB_00612a8a:
    bVar5 = true;
    if (this->m_hash_table != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
      memset(this->m_hash_table,0,(ulong)uVar2 << 3);
    }
  }
  return bVar5;
}

Assistant:

bool ON_SubD_FixedSizeHeap::Internal_ReserveSubDWorkspace_HashTable()
{
  const unsigned int hash_capacity = (m_v_capacity > 0) ? (m_v_capacity / 4 + 1) : 0;
  m_h_count = 0;
  if (hash_capacity > m_h_capacity)
  {
    m_h_capacity = 0;
    if (nullptr != m_hash_elements)
    {
      ON_SubD__Free(m_hash_elements);
      m_hash_elements = nullptr;
    }
    if (nullptr != m_hash_table)
    {
      ON_SubD__Free(m_hash_table);
      m_hash_table = nullptr;
    }
    m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement**)ON_SubD__Allocate(hash_capacity * sizeof(*m_hash_table));
    if (nullptr == m_hash_table)
      return false;
    m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement*)ON_SubD__Allocate(m_v_capacity * sizeof(*m_hash_elements));
    if (nullptr == m_hash_elements)
    {
      ON_SubD__Free(m_hash_table);
      m_hash_table = nullptr;
      return false;
    }
    m_h_capacity = hash_capacity;
  }
  if ( m_h_capacity > 0 && nullptr != m_hash_table)
    memset(m_hash_table, 0, m_h_capacity * sizeof(*m_hash_table));
  return true;
}